

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_enc.c
# Opt level: O0

int EVP_CIPHER_CTX_reset(EVP_CIPHER_CTX *ctx)

{
  long lVar1;
  long lVar2;
  int iVar3;
  EVP_CIPHER *in_RDI;
  
  if (in_RDI != (EVP_CIPHER *)0x0) {
    lVar1._0_4_ = in_RDI->nid;
    lVar1._4_4_ = in_RDI->block_size;
    if ((lVar1 == 0) || (*(long *)(*(long *)in_RDI + 0x78) == 0)) {
      lVar2._0_4_ = in_RDI->nid;
      lVar2._4_4_ = in_RDI->block_size;
      if (lVar2 != 0) {
        if ((*(long *)(*(long *)in_RDI + 0x30) != 0) &&
           (iVar3 = (**(code **)(*(long *)in_RDI + 0x30))(in_RDI), iVar3 == 0)) {
          return 0;
        }
        if ((in_RDI->prov != (OSSL_PROVIDER *)0x0) && (*(int *)(*(long *)in_RDI + 0x38) != 0)) {
          OPENSSL_cleanse(in_RDI->prov,(long)*(int *)(*(long *)in_RDI + 0x38));
        }
      }
      CRYPTO_free(in_RDI->prov);
      ENGINE_finish(*(ENGINE **)&in_RDI->key_len);
      memset(in_RDI,0,0xb8);
    }
    else {
      if (in_RDI->cupdate != (undefined1 *)0x0) {
        if (*(long *)(*(long *)in_RDI + 0xc0) != 0) {
          (**(code **)(*(long *)in_RDI + 0xc0))(in_RDI->cupdate);
        }
        in_RDI->cupdate = (undefined1 *)0x0;
      }
      if (in_RDI->cfinal != (OSSL_FUNC_cipher_final_fn *)0x0) {
        EVP_CIPHER_free(in_RDI);
      }
      memset(in_RDI,0,0xb8);
    }
  }
  return 1;
}

Assistant:

int EVP_CIPHER_CTX_reset(EVP_CIPHER_CTX *ctx)
{
    if (ctx == NULL)
        return 1;

    if (ctx->cipher == NULL || ctx->cipher->prov == NULL)
        goto legacy;

    if (ctx->algctx != NULL) {
        if (ctx->cipher->freectx != NULL)
            ctx->cipher->freectx(ctx->algctx);
        ctx->algctx = NULL;
    }
    if (ctx->fetched_cipher != NULL)
        EVP_CIPHER_free(ctx->fetched_cipher);
    memset(ctx, 0, sizeof(*ctx));

    return 1;

    /* Remove legacy code below when legacy support is removed. */
 legacy:

    if (ctx->cipher != NULL) {
        if (ctx->cipher->cleanup && !ctx->cipher->cleanup(ctx))
            return 0;
        /* Cleanse cipher context data */
        if (ctx->cipher_data && ctx->cipher->ctx_size)
            OPENSSL_cleanse(ctx->cipher_data, ctx->cipher->ctx_size);
    }
    OPENSSL_free(ctx->cipher_data);
#if !defined(OPENSSL_NO_ENGINE) && !defined(FIPS_MODULE)
    ENGINE_finish(ctx->engine);
#endif
    memset(ctx, 0, sizeof(*ctx));
    return 1;
}